

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

SDL_bool Surface20to12InPlace(SDL_Surface *surface20,SDL12_Surface *surface12)

{
  byte *pbVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  ulong uVar3;
  uint uVar5;
  SDL_Palette *pSVar6;
  SDL_PixelFormat *pSVar7;
  Uint8 UVar8;
  Uint8 UVar9;
  Uint8 UVar10;
  Uint8 UVar11;
  Uint8 UVar12;
  Uint8 UVar13;
  Uint8 UVar14;
  Uint32 UVar15;
  Uint32 UVar16;
  Uint32 UVar17;
  int iVar18;
  SDL12_Palette *pSVar19;
  SDL12_PixelFormat *pSVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM2 [16];
  SDL_BlendMode blendmode;
  SDL_BlendMode local_2c;
  
  local_2c = SDL_BLENDMODE_NONE;
  if (surface20 == (SDL_Surface *)0x0) {
    return SDL_FALSE;
  }
  if (0xffff < surface20->pitch) {
    (*SDL20_SetError)("Pitch is too large");
    return SDL_FALSE;
  }
  if (surface20->format->palette == (SDL_Palette *)0x0) {
    pSVar19 = (SDL12_Palette *)0x0;
  }
  else {
    pSVar19 = (SDL12_Palette *)(*SDL20_malloc)(0x10);
    if (pSVar19 == (SDL12_Palette *)0x0) {
      pSVar19 = (SDL12_Palette *)0x0;
      goto LAB_001157d1;
    }
  }
  pSVar20 = (SDL12_PixelFormat *)(*SDL20_malloc)(0x30);
  if (pSVar20 != (SDL12_PixelFormat *)0x0) {
    if (pSVar19 != (SDL12_Palette *)0x0) {
      (*SDL20_memset)(pSVar19,0,0x10);
      pSVar6 = surface20->format->palette;
      pSVar19->ncolors = pSVar6->ncolors;
      pSVar19->colors = pSVar6->colors;
    }
    (*SDL20_memset)(pSVar20,0,0x30);
    pSVar20->palette = pSVar19;
    pSVar7 = surface20->format;
    pSVar20->BitsPerPixel = pSVar7->BitsPerPixel;
    pSVar20->BytesPerPixel = pSVar7->BytesPerPixel;
    UVar8 = pSVar7->Gloss;
    UVar9 = pSVar7->Bloss;
    UVar10 = pSVar7->Aloss;
    UVar11 = pSVar7->Rshift;
    UVar12 = pSVar7->Gshift;
    UVar13 = pSVar7->Bshift;
    UVar14 = pSVar7->Ashift;
    pSVar20->Rloss = pSVar7->Rloss;
    pSVar20->Gloss = UVar8;
    pSVar20->Bloss = UVar9;
    pSVar20->Aloss = UVar10;
    pSVar20->Rshift = UVar11;
    pSVar20->Gshift = UVar12;
    pSVar20->Bshift = UVar13;
    pSVar20->Ashift = UVar14;
    UVar15 = pSVar7->Gmask;
    UVar16 = pSVar7->Bmask;
    UVar17 = pSVar7->Amask;
    pSVar20->Rmask = pSVar7->Rmask;
    pSVar20->Gmask = UVar15;
    pSVar20->Bmask = UVar16;
    pSVar20->Amask = UVar17;
    iVar18 = (*SDL20_GetColorKey)(surface20,&pSVar20->colorkey);
    if (iVar18 < 0) {
      pSVar20->colorkey = 0;
    }
    else {
      pbVar1 = (byte *)((long)&surface12->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
    iVar18 = (*SDL20_GetSurfaceAlphaMod)(surface20,&pSVar20->alpha);
    if (iVar18 < 0) {
      pSVar20->alpha = 0xff;
    }
    (*SDL20_memset)(surface12,0,0x58);
    uVar5 = surface20->flags;
    if ((uVar5 & 1) != 0) {
      pbVar1 = (byte *)((long)&surface12->flags + 3);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((uVar5 & 2) != 0) {
      pbVar1 = (byte *)((long)&surface12->flags + 1);
      *pbVar1 = *pbVar1 | 0x40;
    }
    iVar18 = (*SDL20_GetSurfaceBlendMode)(surface20,&local_2c);
    if ((iVar18 == 0) && (local_2c == SDL_BLENDMODE_BLEND)) {
      pbVar1 = (byte *)((long)&surface12->flags + 2);
      *pbVar1 = *pbVar1 | 1;
    }
    surface12->format = pSVar20;
    iVar18 = surface20->h;
    surface12->w = surface20->w;
    surface12->h = iVar18;
    surface12->pitch = (Uint16)surface20->pitch;
    surface12->pixels = surface20->pixels;
    surface12->offset = 0;
    surface12->surface20 = surface20;
    uVar2 = (surface20->clip_rect).x;
    uVar4 = (surface20->clip_rect).y;
    auVar21._4_4_ = uVar4;
    auVar21._0_4_ = uVar2;
    auVar21._8_8_ = 0;
    auVar21 = pshuflw(auVar21,auVar21,0xe8);
    (surface12->clip_rect).x = (short)auVar21._0_4_;
    (surface12->clip_rect).y = (short)((uint)auVar21._0_4_ >> 0x10);
    uVar3._0_4_ = (surface20->clip_rect).w;
    uVar3._4_4_ = (surface20->clip_rect).h;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar3;
    auVar22 = pshuflw(in_XMM2,auVar22,0xe8);
    auVar23._0_4_ = -(uint)(0 < (int)(undefined4)uVar3);
    auVar23._4_4_ = -(uint)(0 < (int)uVar3._4_4_);
    auVar23._8_8_ = 0;
    auVar21 = pshuflw(auVar23,auVar23,0xe8);
    uVar5 = auVar21._0_4_ & auVar22._0_4_;
    (surface12->clip_rect).w = (short)uVar5;
    (surface12->clip_rect).h = (short)(uVar5 >> 0x10);
    surface12->refcount = surface20->refcount;
    return SDL_TRUE;
  }
LAB_001157d1:
  (*SDL20_free)(pSVar19);
  (*SDL20_free)((void *)0x0);
  return SDL_FALSE;
}

Assistant:

static SDL_bool
Surface20to12InPlace(SDL_Surface *surface20,
                     SDL12_Surface *surface12)
{
    SDL_BlendMode blendmode = SDL_BLENDMODE_NONE;
    SDL12_Palette *palette12 = NULL;
    SDL12_PixelFormat *format12 = NULL;
    Uint32 flags = 0;

    if (!surface20) {
        return SDL_FALSE;
    }
    if (surface20->pitch > 65535) {
        SDL20_SetError("Pitch is too large");  /* can't fit to 16-bits */
        return SDL_FALSE;
    }

    if (surface20->format->palette) {
        palette12 = (SDL12_Palette *) SDL20_malloc(sizeof (SDL12_Palette));
        if (!palette12) {
            goto failed;
        }
    }

    format12 = (SDL12_PixelFormat *) SDL20_malloc(sizeof (SDL12_PixelFormat));
    if (!format12) {
        goto failed;
    }

    if (palette12) {
        SDL20_zerop(palette12);
        SDL_assert(surface20->format->palette);
        palette12->ncolors = surface20->format->palette->ncolors;
        palette12->colors = surface20->format->palette->colors;
    }

    SDL20_zerop(format12);
    format12->palette = palette12;
    format12->BitsPerPixel = surface20->format->BitsPerPixel;
    format12->BytesPerPixel = surface20->format->BytesPerPixel;
    format12->Rloss = surface20->format->Rloss;
    format12->Gloss = surface20->format->Gloss;
    format12->Bloss = surface20->format->Bloss;
    format12->Aloss = surface20->format->Aloss;
    format12->Rshift = surface20->format->Rshift;
    format12->Gshift = surface20->format->Gshift;
    format12->Bshift = surface20->format->Bshift;
    format12->Ashift = surface20->format->Ashift;
    format12->Rmask = surface20->format->Rmask;
    format12->Gmask = surface20->format->Gmask;
    format12->Bmask = surface20->format->Bmask;
    format12->Amask = surface20->format->Amask;

    if (SDL20_GetColorKey(surface20, &format12->colorkey) < 0) {
        format12->colorkey = 0;
    } else {
        surface12->flags |= SDL12_SRCCOLORKEY;
    }

    if (SDL20_GetSurfaceAlphaMod(surface20, &format12->alpha) < 0) {
        format12->alpha = 255;
    }

    SDL20_zerop(surface12);
    flags = surface20->flags;
    flags &= ~SDL_SIMD_ALIGNED;  /* we don't need to map this to 1.2 */
    #define MAPSURFACEFLAGS(fl) { if (surface20->flags & SDL_##fl) { surface12->flags |= SDL12_##fl; flags &= ~SDL_##fl; } }
    MAPSURFACEFLAGS(PREALLOC);
    MAPSURFACEFLAGS(RLEACCEL);
    /*MAPSURFACEFLAGS(DONTFREE);*/
    #undef MAPSURFACEFLAGS
    SDL_assert(flags == 0);  /* non-zero if there's a flag we didn't map. */

    if ((SDL20_GetSurfaceBlendMode(surface20, &blendmode) == 0) && (blendmode == SDL_BLENDMODE_BLEND)) {
        surface12->flags |= SDL12_SRCALPHA;
    }

    surface12->format = format12;
    surface12->w = surface20->w;
    surface12->h = surface20->h;
    surface12->pitch = (Uint16) surface20->pitch;
    surface12->pixels = surface20->pixels;
    surface12->offset = 0;
    surface12->surface20 = surface20;
    Rect20to12(&surface20->clip_rect, &surface12->clip_rect);
    surface12->refcount = surface20->refcount;

    return SDL_TRUE;

failed:
    SDL20_free(palette12);
    SDL20_free(format12);
    return SDL_FALSE;
}